

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

void asmjit::ConstPool_addGap(ConstPool *self,size_t offset,size_t length)

{
  uint8_t uVar1;
  uint *puVar2;
  anon_union_4_2_424c626f_for_ArchInfo_0 *paVar3;
  anon_union_4_2_424c626f_for_ArchInfo_0 aVar4;
  uint uVar5;
  ArchInfo AVar6;
  uint uVar7;
  uint uVar8;
  anon_union_4_2_424c626f_for_ArchInfo_0 aVar9;
  uint uVar10;
  Gap *pGVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t uVar14;
  ArchInfo AVar15;
  uint uVar16;
  Zone *this;
  ArchInfo *this_00;
  ArchInfo AVar17;
  uint uVar18;
  anon_union_4_2_424c626f_for_ArchInfo_0 *paVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  size_t sVar24;
  anon_union_4_2_424c626f_for_ArchInfo_0 *paVar25;
  size_t __n;
  bool bVar26;
  uint in_XCR0;
  undefined8 auStack_278 [68];
  ulong uStack_58;
  size_t sStack_50;
  ulong uStack_48;
  ulong uStack_40;
  ConstPool *pCStack_38;
  
  sVar24 = offset;
  do {
    if (length == 0) {
      return;
    }
    if (length < 0x10 || (sVar24 & 0xf) != 0) {
      if (length < 8 || (sVar24 & 7) != 0) {
        if (length < 4 || (sVar24 & 3) != 0) {
          uVar22 = (ulong)((sVar24 & 1) == 0 && length != 1);
          sVar20 = uVar22 + 1;
        }
        else {
          sVar20 = 4;
          uVar22 = 2;
        }
      }
      else {
        sVar20 = 8;
        uVar22 = 3;
      }
    }
    else {
      sVar20 = 0x10;
      uVar22 = 4;
    }
    pGVar11 = self->_gapPool;
    if (pGVar11 == (Gap *)0x0) {
      this = self->_zone;
      pGVar11 = (Gap *)this->_ptr;
      if ((ulong)((long)this->_end - (long)pGVar11) < 0x18) {
        offset = (size_t)&DAT_00000018;
        pGVar11 = (Gap *)Zone::_alloc(this,0x18);
      }
      else {
        this->_ptr = (uint8_t *)(pGVar11 + 1);
        if ((Gap *)this->_end < pGVar11 + 1) {
          ConstPool_addGap();
          lVar21 = 0;
          this_00 = (ArchInfo *)offset;
          uStack_58 = length;
          sStack_50 = sVar20;
          uStack_48 = uVar22;
          uStack_40 = sVar24;
          pCStack_38 = self;
          memset((void *)offset,0,(size_t)this[6]._block);
          __n = 1;
          do {
            if ((&this->_end)[lVar21 * 3] != (uint8_t *)0x0) {
              lVar23 = 0;
              puVar13 = (&this->_end)[lVar21 * 3];
              do {
                puVar12 = *(uint8_t **)puVar13;
                if (puVar12 == (uint8_t *)0x0) {
                  while( true ) {
                    if (-1 < *(int *)(puVar13 + 0x10)) {
                      this_00 = (ArchInfo *)
                                ((long)&((ArchInfo *)offset)->field_0 +
                                (ulong)*(uint *)(puVar13 + 0x14));
                      memcpy(this_00,puVar13 + 0x18,__n);
                    }
                    puVar12 = *(uint8_t **)(puVar13 + 8);
                    bVar26 = puVar12 != (uint8_t *)0x0;
                    if (bVar26) goto LAB_001157a6;
                    if (lVar23 == 0) break;
                    puVar13 = (uint8_t *)auStack_278[lVar23 + 2];
                    lVar23 = lVar23 + -1;
                  }
                  lVar23 = 0;
                  puVar12 = (uint8_t *)0x0;
                }
                else {
                  if (lVar23 == 0x40) {
                    ConstPool::fill();
                    lVar21 = 0;
                    memset(this_00,0,0x98);
                    ArchInfo::init(this_00,(EVP_PKEY_CTX *)0x2);
                    this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 2;
                    puVar2 = (uint *)cpuid_basic_info(0);
                    uVar16 = *puVar2;
                    AVar15.field_0 =
                         (anon_union_4_2_424c626f_for_ArchInfo_0)
                         ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar2 + 1))->_signature;
                    AVar17.field_0 =
                         (anon_union_4_2_424c626f_for_ArchInfo_0)
                         ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar2 + 2))->_signature;
                    AVar6.field_0 =
                         (anon_union_4_2_424c626f_for_ArchInfo_0)
                         ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar2 + 3))->_signature;
                    this_00[1].field_0 = AVar15.field_0;
                    this_00[2].field_0 = AVar17.field_0;
                    this_00[3].field_0 = AVar6.field_0;
                    goto LAB_0011581a;
                  }
                  auStack_278[lVar23 + 3] = puVar13;
                  lVar23 = lVar23 + 1;
                  bVar26 = true;
                }
LAB_001157a6:
                puVar13 = puVar12;
              } while (bVar26);
            }
            __n = __n * 2;
            lVar21 = lVar21 + 1;
            if (lVar21 == 6) {
              return;
            }
          } while( true );
        }
      }
    }
    else {
      self->_gapPool = pGVar11->_next;
    }
    if (pGVar11 == (Gap *)0x0) {
      return;
    }
    pGVar11->_next = self->_gaps[uVar22];
    self->_gaps[uVar22] = pGVar11;
    pGVar11->_offset = sVar24;
    pGVar11->_length = sVar20;
    sVar24 = sVar24 + sVar20;
    length = length - sVar20;
  } while( true );
  while (lVar21 = lVar21 + 0x10, lVar21 != 0x40) {
LAB_0011581a:
    if (((AVar15.field_0 ==
          (anon_union_4_2_424c626f_for_ArchInfo_0)
          ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(&DAT_00134b54 + lVar21))->_signature) &&
        (AVar17.field_0 ==
         (anon_union_4_2_424c626f_for_ArchInfo_0)
         ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(&DAT_00134b58 + lVar21))->_signature)) &&
       (AVar6.field_0 ==
        (anon_union_4_2_424c626f_for_ArchInfo_0)
        ((anon_union_4_2_424c626f_for_ArchInfo_0 *)(&DAT_00134b5c + lVar21))->_signature)) {
      aVar9 = *(anon_union_4_2_424c626f_for_ArchInfo_0 *)
               (&x86GetCpuVendorID(char_const*)::vendorList + lVar21);
      goto LAB_00115841;
    }
  }
  aVar9._signature = 0;
LAB_00115841:
  this_00[0x15].field_0 = aVar9;
  if (uVar16 == 0) {
    uVar18 = 0;
  }
  else {
    puVar2 = (uint *)cpuid_Version_info(1);
    uVar18 = *puVar2;
    uVar10 = puVar2[1];
    uVar5 = puVar2[2];
    uVar7 = puVar2[3];
    AVar17.field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar18 >> 8 & 0xf);
    this_00[0x16].field_0 = AVar17.field_0;
    AVar15.field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar18 >> 4 & 0xf);
    this_00[0x17].field_0 = AVar15.field_0;
    this_00[0x18].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar18 & 0xf);
    if (AVar17.field_0 == 0xf) {
      this_00[0x16].field_0 =
           (anon_union_4_2_424c626f_for_ArchInfo_0)((uVar18 >> 0x14 & 0xff) + 0xf);
      this_00[0x17].field_0 =
           (anon_union_4_2_424c626f_for_ArchInfo_0)((uint)AVar15.field_0 | uVar18 >> 0xc & 0xf0);
    }
    this_00[0x22].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar18 >> 0xc & 3);
    this_00[0x23].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar10 & 0xff);
    this_00[0x24].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar10 >> 5 & 0x7f8);
    this_00[0x25].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar10 >> 0x10 & 0xff);
    if ((uVar7 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 0x10;
    }
    if ((uVar7 & 2) != 0) {
      this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 0x80;
    }
    if ((uVar7 & 8) != 0) {
      this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 4;
    }
    if ((uVar7 >> 9 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 0x20;
    }
    if ((uVar7 >> 0xd & 1) != 0) {
      this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 0x80;
    }
    if ((uVar7 >> 0x13 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 0x80;
    }
    if ((uVar7 >> 0x14 & 1) != 0) {
      this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 1;
    }
    if ((uVar7 >> 0x16 & 1) != 0) {
      this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 8;
    }
    if ((uVar7 >> 0x17 & 1) != 0) {
      this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 0x10;
    }
    if ((uVar7 >> 0x19 & 1) != 0) {
      this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 0x40;
    }
    if ((uVar7 >> 0x1a & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._subType;
      *puVar13 = *puVar13 | 0x20;
    }
    if ((uVar7 >> 0x1b & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._subType;
      *puVar13 = *puVar13 | 0x80;
    }
    if ((uVar7 >> 0x1e & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._subType;
      *puVar13 = *puVar13 | 1;
    }
    if ((uVar5 & 0x10) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._subType;
      *puVar13 = *puVar13 | 2;
    }
    if ((uVar5 & 0x20) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._subType;
      *puVar13 = *puVar13 | 1;
    }
    if ((uVar5 >> 8 & 1) != 0) {
      this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 0x40;
    }
    if ((short)uVar5 < 0) {
      this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 0x20;
    }
    if ((uVar5 >> 0x13 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._subType;
      *puVar13 = *puVar13 | 8;
    }
    if ((uVar5 >> 0x17 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._gpSize;
      *puVar13 = *puVar13 | 0x20;
    }
    if ((uVar5 >> 0x18 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._gpSize;
      *puVar13 = *puVar13 | 8;
    }
    if ((uVar5 >> 0x19 & 1) != 0) {
      this_00[0x1a].field_0._signature = this_00[0x1a].field_0._signature | 0x4400000;
    }
    if ((uVar5 >> 0x1a & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 0xc;
    }
    if ((uVar5 >> 0x1c & 1) != 0) {
      this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 8;
    }
    uVar18 = 0;
    if ((~uVar7 & 0xc000000) == 0) {
      uVar18 = in_XCR0;
    }
    if (((~uVar18 & 6) == 0 & (byte)(uVar7 >> 0x1c)) == 1) {
      uVar10 = (uVar7 & 0x4000) << 5 | this_00[0x1b].field_0._signature;
      this_00[0x1b].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar10 | 0x10000);
      if ((uVar7 >> 0x1d & 1) != 0) {
        this_00[0x1b].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar10 | 0x50000);
      }
    }
  }
  if (uVar16 < 7) {
    uVar10 = 0;
  }
  else {
    lVar21 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar5 = *(uint *)(lVar21 + 4);
    uVar7 = *(uint *)(lVar21 + 8);
    uVar8 = *(uint *)(lVar21 + 0xc);
    if ((uVar5 & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 0x80;
    }
    if ((uVar5 & 8) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpSize;
      *puVar13 = *puVar13 | 0x40;
    }
    if ((uVar5 & 0x10) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 8;
    }
    if ((char)uVar5 < '\0') {
      puVar13 = &this_00[0x1b].field_0.field_0._subType;
      *puVar13 = *puVar13 | 8;
    }
    if ((uVar5 >> 8 & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpSize;
      *puVar13 = *puVar13 | 0x80;
    }
    if ((uVar5 >> 9 & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 0x40;
    }
    if ((uVar5 >> 0xb & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 0x10;
    }
    if ((uVar5 >> 0x12 & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._subType;
      *puVar13 = *puVar13 | 2;
    }
    if ((uVar5 >> 0x13 & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 1;
    }
    if ((uVar5 >> 0x14 & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._subType;
      *puVar13 = *puVar13 | 4;
    }
    if ((uVar5 >> 0x16 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._subType;
      *puVar13 = *puVar13 | 0x80;
    }
    if ((uVar5 >> 0x17 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._subType;
      *puVar13 = *puVar13 | 0x10;
    }
    if ((uVar5 >> 0x18 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._subType;
      *puVar13 = *puVar13 | 0x20;
    }
    if ((uVar5 >> 0x1d & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._subType;
      *puVar13 = *puVar13 | 0x10;
    }
    if ((uVar8 & 1) != 0) {
      puVar13 = &this_00[0x1a].field_0.field_0._gpSize;
      *puVar13 = *puVar13 | 2;
    }
    if ((uVar5 & 0x810) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 0x20;
    }
    uVar10 = uVar5 >> 0xe;
    if ((uVar5 & 0x20) != 0 && (this_00[0x1b].field_0._signature >> 0x10 & 1) != 0) {
      this_00[0x1b].field_0 =
           (anon_union_4_2_424c626f_for_ArchInfo_0)(this_00[0x1b].field_0._signature | 0x20000);
    }
    if (((uVar5 >> 0x10 & 1) != 0) && ((uVar18 & 0xe6) == 0xe6)) {
      this_00[0x1c].field_0 =
           (anon_union_4_2_424c626f_for_ArchInfo_0)
           (uVar10 & 0x80 | uVar5 >> 0xd & 0x10 | this_00[0x1c].field_0._signature | 1);
      if ((uVar5 >> 0x1a & 1) != 0) {
        this_00[0x1c].field_0.field_0._type = this_00[0x1c].field_0.field_0._type | 4;
      }
      if ((uVar5 >> 0x1b & 1) != 0) {
        this_00[0x1c].field_0.field_0._type = this_00[0x1c].field_0.field_0._type | 8;
      }
      if ((uVar5 >> 0x1c & 1) != 0) {
        this_00[0x1c].field_0.field_0._type = this_00[0x1c].field_0.field_0._type | 2;
      }
      if ((uVar5 >> 0x1e & 1) != 0) {
        this_00[0x1c].field_0.field_0._type = this_00[0x1c].field_0.field_0._type | 0x20;
      }
      if ((int)uVar5 < 0) {
        this_00[0x1c].field_0.field_0._type = this_00[0x1c].field_0.field_0._type | 0x40;
      }
      if ((uVar8 & 2) != 0) {
        puVar13 = &this_00[0x1c].field_0.field_0._subType;
        *puVar13 = *puVar13 | 1;
      }
      if ((uVar8 >> 0xe & 1) != 0) {
        puVar13 = &this_00[0x1c].field_0.field_0._subType;
        *puVar13 = *puVar13 | 2;
      }
      if ((uVar7 & 4) != 0) {
        puVar13 = &this_00[0x1c].field_0.field_0._subType;
        *puVar13 = *puVar13 | 4;
      }
      if ((uVar7 & 8) != 0) {
        puVar13 = &this_00[0x1c].field_0.field_0._subType;
        *puVar13 = *puVar13 | 8;
      }
    }
  }
  if (0xc < uVar16) {
    puVar2 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    if (((~(uVar18 & *puVar2) & 0x18) == 0) && ((uVar10 & 1) != 0)) {
      puVar13 = &this_00[0x1b].field_0.field_0._gpCount;
      *puVar13 = *puVar13 | 4;
    }
    puVar2 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    if ((*puVar2 & 1) != 0) {
      puVar13 = &this_00[0x1b].field_0.field_0._subType;
      *puVar13 = *puVar13 | 0x40;
    }
  }
  paVar19 = &this_00[5].field_0;
  uVar16 = 0x80000000;
  aVar9._signature = 0x80000000;
  paVar25 = paVar19;
  do {
    if (uVar16 == 0) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_basic_info(0);
    }
    else if (uVar16 == 1) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Version_info(1);
    }
    else if (uVar16 == 2) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_cache_tlb_info(2);
    }
    else if (uVar16 == 3) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_serial_info(3);
    }
    else if (uVar16 == 4) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
               cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (uVar16 == 5) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (uVar16 == 6) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Thermal_Power_Management_info(6);
    }
    else if (uVar16 == 7) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (uVar16 == 9) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Direct_Cache_Access_info(9);
    }
    else if (uVar16 == 10) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
               cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (uVar16 == 0xb) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Extended_Topology_info(0xb);
    }
    else if (uVar16 == 0xd) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Processor_Extended_States_info(0xd);
    }
    else if (uVar16 == 0xf) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Quality_of_Service_info(0xf);
    }
    else if (uVar16 == 0x80000002) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_brand_part1_info(0x80000002);
    }
    else if (uVar16 == 0x80000003) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_brand_part2_info(0x80000003);
    }
    else if (uVar16 == 0x80000004) {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_brand_part3_info(0x80000004);
    }
    else {
      paVar3 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid(uVar16);
    }
    aVar4 = (anon_union_4_2_424c626f_for_ArchInfo_0)paVar3->_signature;
    uVar18 = paVar3[1]._signature;
    uVar10 = paVar3[2]._signature;
    uVar5 = paVar3[3]._signature;
    switch(uVar16) {
    case 0x80000000:
      aVar9 = aVar4;
      if (0x80000007 < aVar4._signature) {
        aVar9._signature = 0x80000008;
      }
      uVar16 = 0x80000000;
      break;
    case 0x80000001:
      if ((uVar5 & 1) != 0) {
        puVar13 = &this_00[0x1a].field_0.field_0._gpSize;
        *puVar13 = *puVar13 | 4;
      }
      if ((uVar5 & 0x20) != 0) {
        this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 0x20;
      }
      if ((uVar5 & 0x40) != 0) {
        puVar13 = &this_00[0x1a].field_0.field_0._gpCount;
        *puVar13 = *puVar13 | 0x40;
      }
      if ((char)uVar5 < '\0') {
        this_00[0x1b].field_0.field_0._type = this_00[0x1b].field_0.field_0._type | 2;
      }
      if ((uVar5 >> 8 & 1) != 0) {
        puVar13 = &this_00[0x1a].field_0.field_0._gpSize;
        *puVar13 = *puVar13 | 1;
      }
      if ((uVar5 >> 0x15 & 1) != 0) {
        puVar13 = &this_00[0x1b].field_0.field_0._gpCount;
        *puVar13 = *puVar13 | 2;
      }
      if ((uVar10 >> 0x14 & 1) != 0) {
        this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 4;
      }
      if ((uVar10 >> 0x15 & 1) != 0) {
        puVar13 = &this_00[0x1a].field_0.field_0._gpSize;
        *puVar13 = *puVar13 | 0x10;
      }
      if ((uVar10 >> 0x16 & 1) != 0) {
        puVar13 = &this_00[0x1a].field_0.field_0._gpSize;
        *puVar13 = *puVar13 | 0x40;
      }
      if ((uVar10 >> 0x1b & 1) != 0) {
        puVar13 = &this_00[0x1a].field_0.field_0._subType;
        *puVar13 = *puVar13 | 4;
      }
      if ((uVar10 >> 0x1e & 1) != 0) {
        this_00[0x1a].field_0._signature = this_00[0x1a].field_0._signature | 0x1400000;
      }
      if ((int)uVar10 < 0) {
        puVar13 = &this_00[0x1a].field_0.field_0._gpSize;
        *puVar13 = *puVar13 | 0x80;
      }
      if ((this_00[0x1b].field_0._signature >> 0x10 & 1) != 0) {
        if ((uVar5 >> 0xb & 1) != 0) {
          this_00[0x1b].field_0 =
               (anon_union_4_2_424c626f_for_ArchInfo_0)(this_00[0x1b].field_0._signature | 0x200000)
          ;
        }
        if ((uVar5 >> 0x10 & 1) != 0) {
          puVar13 = &this_00[0x1b].field_0.field_0._gpSize;
          *puVar13 = *puVar13 | 0x10;
        }
      }
      uVar16 = 0x80000001;
      if ((this_00[0x15].field_0._signature == 2) && ((uVar5 & 0x10) != 0)) {
        this_00[0x1a].field_0.field_0._type = this_00[0x1a].field_0.field_0._type | 0x10;
      }
      break;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
      paVar25->_signature = (uint32_t)aVar4;
      paVar25[1]._signature = uVar18;
      paVar25[2]._signature = uVar5;
      paVar25[3]._signature = uVar10;
      paVar25 = paVar25 + 4;
      if (uVar16 == 0x80000004) {
        uVar16 = 0x80000007;
      }
      break;
    case 0x80000008:
      uVar16 = 0x80000008;
      if ((uVar18 & 1) != 0) {
        puVar13 = &this_00[0x1a].field_0.field_0._subType;
        *puVar13 = *puVar13 | 0x40;
      }
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 <= aVar9._signature);
  uVar1 = this_00[5].field_0.field_0._type;
  this_00[5].field_0.field_0._type = '\0';
  puVar13 = &this_00[5].field_0.field_0._subType;
  uVar14 = '\0';
  do {
    if (uVar1 == ' ') {
      if (((uVar14 != '@') && (*puVar13 != ' ')) && (*puVar13 != '@')) goto LAB_00115d4a;
    }
    else {
      if (uVar1 == '\0') {
        (paVar19->field_0)._type = '\0';
        lVar21 = sysconf(0x54);
        aVar9._signature = 1;
        if (1 < lVar21) {
          aVar9._signature = (uint32_t)lVar21;
        }
        this_00[0x19].field_0 = aVar9;
        return;
      }
LAB_00115d4a:
      (paVar19->field_0)._type = uVar1;
      paVar19 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)&(paVar19->field_0)._subType;
      uVar14 = uVar1;
    }
    uVar1 = *puVar13;
    *puVar13 = '\0';
    puVar13 = puVar13 + 1;
  } while( true );
}

Assistant:

static void ConstPool_addGap(ConstPool* self, size_t offset, size_t length) noexcept {
  ASMJIT_ASSERT(length > 0);

  while (length > 0) {
    size_t gapIndex;
    size_t gapLength;

      gapIndex = ConstPool::kIndex16;
    if (length >= 16 && Utils::isAligned<size_t>(offset, 16)) {
      gapLength = 16;
    }
    else if (length >= 8 && Utils::isAligned<size_t>(offset, 8)) {
      gapIndex = ConstPool::kIndex8;
      gapLength = 8;
    }
    else if (length >= 4 && Utils::isAligned<size_t>(offset, 4)) {
      gapIndex = ConstPool::kIndex4;
      gapLength = 4;
    }
    else if (length >= 2 && Utils::isAligned<size_t>(offset, 2)) {
      gapIndex = ConstPool::kIndex2;
      gapLength = 2;
    }
    else {
      gapIndex = ConstPool::kIndex1;
      gapLength = 1;
    }

    // We don't have to check for errors here, if this failed nothing really
    // happened (just the gap won't be visible) and it will fail again at
    // place where checking will cause kErrorNoHeapMemory.
    ConstPool::Gap* gap = ConstPool_allocGap(self);
    if (!gap) return;

    gap->_next = self->_gaps[gapIndex];
    self->_gaps[gapIndex] = gap;

    gap->_offset = offset;
    gap->_length = gapLength;

    offset += gapLength;
    length -= gapLength;
  }
}